

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_main_oj.cpp
# Opt level: O1

int __thiscall
Solution::maximumMinutes
          (Solution *this,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *g)

{
  bool bVar1;
  int iVar2;
  int t;
  int iVar3;
  int ans;
  int local_54;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  iVar3 = 1000000000;
  iVar2 = -1;
  do {
    t = iVar3 + iVar2 >> 1;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector(&local_48,g);
    bVar1 = ok(this,&local_48,t);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_48);
    if (bVar1) {
      iVar2 = t + 1;
      local_54 = t;
    }
    else {
      iVar3 = t + -1;
    }
  } while (iVar2 <= iVar3);
  return local_54;
}

Assistant:

int maximumMinutes(vector<vector<int>>& g) {
        int l = -1, r = 1e9, mid, ans;
        while(l <= r)
        {
            mid = (l+r)>>1;
            if(ok(g, mid))
            {
                ans = mid;
                l = mid+1;
            }
            else
                r = mid-1;
        }
        return ans;
    }